

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_run_mode.h
# Opt level: O1

int32_t __thiscall
charls::context_run_mode::compute_error_value(context_run_mode *this,int32_t temp,int32_t k)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  
  iVar1 = (temp & 1U) + temp;
  uVar4 = 1;
  if (k == 0) {
    uVar4 = (uint)((uint)this->n_ <= (uint)this->nn_ * 2);
  }
  iVar2 = iVar1 / 2;
  if (uVar4 == (temp & 1U)) {
    if (((-2 < iVar1 || k != 0) || (bVar3 = true, (uint)this->n_ <= (uint)this->nn_ * 2)) &&
       ((iVar1 < 2 || (bVar3 = true, (uint)this->nn_ * 2 < (uint)this->n_)))) {
      bVar3 = k != 0 && 1 < iVar1;
    }
    if (bVar3 != (bool)((byte)temp & 1)) {
      __assert_fail("map == compute_map(-error_value_abs, k)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/context_run_mode.h"
                    ,0x4b,
                    "int32_t charls::context_run_mode::compute_error_value(const int32_t, const int32_t) const"
                   );
    }
    iVar2 = -iVar2;
  }
  else {
    if (((iVar1 < 2 || k != 0) || (bVar3 = true, (uint)this->n_ <= (uint)this->nn_ * 2)) &&
       ((-2 < iVar1 || (bVar3 = true, (uint)this->nn_ * 2 < (uint)this->n_)))) {
      bVar3 = k != 0 && iVar1 < -1;
    }
    if (bVar3 != (bool)((byte)temp & 1)) {
      __assert_fail("map == compute_map(error_value_abs, k)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/context_run_mode.h"
                    ,0x4f,
                    "int32_t charls::context_run_mode::compute_error_value(const int32_t, const int32_t) const"
                   );
    }
  }
  return iVar2;
}

Assistant:

FORCE_INLINE int32_t compute_error_value(const int32_t temp, const int32_t k) const noexcept
    {
        const bool map = temp & 1;
        const int32_t error_value_abs{(temp + static_cast<int32_t>(map)) / 2};

        if ((k != 0 || (2 * nn_ >= n_)) == map)
        {
            ASSERT(map == compute_map(-error_value_abs, k));
            return -error_value_abs;
        }

        ASSERT(map == compute_map(error_value_abs, k));
        return error_value_abs;
    }